

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void thread_dispatch(vw *all,v_array<example_*> examples)

{
  uint64_t *puVar1;
  example **__begin1;
  example **__end1;
  
  puVar1 = &all->p->end_parsed_examples;
  *puVar1 = *puVar1 + ((long)examples._end - (long)examples._begin >> 3);
  for (; examples._end != examples._begin; examples._begin = examples._begin + 1) {
    VW::ptr_queue<example>::push(&all->p->ready_parsed_examples,*examples._begin);
  }
  return;
}

Assistant:

bool is_test_only(uint32_t counter, uint32_t period, uint32_t after, bool holdout_off,
    uint32_t target_modulus)  // target should be 0 in the normal case, or period-1 in the case that emptylines separate
                              // examples
{
  if (holdout_off)
    return false;
  if (after == 0)  // hold out by period
    return (counter % period == target_modulus);
  else  // hold out by position
    return (counter >= after);
}